

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  Descriptor *pDVar1;
  pointer *ppbVar2;
  size_type sVar3;
  once_flag *__once;
  Printer *pPVar4;
  ulong uVar5;
  bool bVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 *puVar9;
  GeneratorOptions *pGVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Descriptor *pDVar12;
  pointer pbVar13;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar14;
  FieldDescriptor *field;
  long lVar15;
  ulong uVar16;
  long lVar17;
  OneofDescriptor *pOVar18;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  GeneratorOptions *local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  GeneratorOptions *local_d8;
  Printer *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_entries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_fields;
  
  pGVar10 = (GeneratorOptions *)desc;
  bVar6 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,(Descriptor *)options);
  local_100 = (GeneratorOptions *)desc;
  local_d8 = options;
  local_d0 = printer;
  if (bVar6) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_88,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)pGVar10);
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < *(int *)(desc + 0x68)) {
      lVar17 = 0;
      lVar15 = 0;
      pFVar14 = extraout_RDX;
      do {
        sVar3 = (((GeneratorOptions *)desc)->namespace_prefix)._M_string_length;
        if (*(int *)(sVar3 + 0x3c + lVar17) == 3) {
          __once = *(once_flag **)(sVar3 + 0x30 + lVar17);
          if (__once != (once_flag *)0x0) {
            local_120._0_8_ = FieldDescriptor::TypeOnceInit;
            local_f8._0_8_ = (FieldDescriptor *)(sVar3 + lVar17);
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (__once,(_func_void_FieldDescriptor_ptr **)local_120,
                       (FieldDescriptor **)local_f8);
            pFVar14 = extraout_RDX_00;
          }
          if ((*(int *)(sVar3 + 0x38 + lVar17) != 0xb) ||
             (bVar6 = FieldDescriptor::is_map_message_type((FieldDescriptor *)(sVar3 + lVar17)),
             pFVar14 = extraout_RDX_01, !bVar6)) {
            (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                      ((string *)local_120,
                       (_anonymous_namespace_ *)
                       ((local_100->namespace_prefix)._M_string_length + lVar17),pFVar14);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&numbers
                       ,(string *)local_120);
            pFVar14 = extraout_RDX_02;
            if ((Descriptor *)local_120._0_8_ != (Descriptor *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_);
              pFVar14 = extraout_RDX_03;
            }
          }
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x98;
        pGVar10 = local_100;
        desc = (Descriptor *)local_100;
      } while (lVar15 < *(int *)((long)&(local_100->library).field_2 + 8));
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_f8,(protobuf *)&numbers,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x3a7a50,(char *)pGVar10);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x3edcd6);
    pPVar4 = local_d0;
    options = local_d8;
    pDVar12 = (Descriptor *)(plVar7 + 2);
    if ((Descriptor *)*plVar7 == pDVar12) {
      local_110._M_allocated_capacity = *(undefined8 *)pDVar12;
      local_110._8_8_ = plVar7[3];
      local_120._0_8_ = (Descriptor *)(local_120 + 0x10);
    }
    else {
      local_110._M_allocated_capacity = *(undefined8 *)pDVar12;
      local_120._0_8_ = (Descriptor *)*plVar7;
    }
    local_120._8_8_ = plVar7[1];
    *plVar7 = (long)pDVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_120);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar11) {
      local_98._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_98._8_8_ = plVar7[3];
      local_a8._M_allocated_capacity = (size_type)&local_98;
    }
    else {
      local_98._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_a8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_a8._8_8_ = plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((Descriptor *)local_120._0_8_ != (Descriptor *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    desc = (Descriptor *)local_100;
    if ((FieldDescriptor *)local_f8._0_8_ != (FieldDescriptor *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&numbers);
    pGVar10 = (GeneratorOptions *)local_88;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[14],char_const*,char[10],std::__cxx11::string>
              (pPVar4,
               "/**\n * List of repeated fields within this message type.\n * @private {!Array<number>}\n * @const\n */\n$classname$$rptfieldarray$ = $rptfields$;\n\n"
               ,(char (*) [10])0x3aca6c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar10,
               (char (*) [14])"rptfieldarray",&(anonymous_namespace)::kRepeatedFieldArrayName,
               (char (*) [10])"rptfields",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_allocated_capacity != &local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  uVar8 = (ulong)*(int *)((long)&(((GeneratorOptions *)desc)->library).field_2 + 8);
  pDVar12 = (Descriptor *)CONCAT71((int7)((ulong)pGVar10 >> 8),0 < (long)uVar8);
  if (0 < (long)uVar8) {
    pDVar12 = (Descriptor *)(((GeneratorOptions *)desc)->namespace_prefix)._M_string_length;
    if (*(long *)(pDVar12 + 0x58) != 0) goto LAB_00245a35;
    pDVar12 = pDVar12 + 0xf0;
    uVar5 = 1;
    do {
      uVar16 = uVar5;
      if (uVar8 == uVar16) break;
      lVar15 = *(long *)pDVar12;
      pDVar12 = pDVar12 + 0x98;
      uVar5 = uVar16 + 1;
    } while (lVar15 == 0);
    pDVar12 = (Descriptor *)CONCAT71((int7)((ulong)pDVar12 >> 8),uVar16 < uVar8);
  }
  if ((char)pDVar12 == '\0') {
    return;
  }
LAB_00245a35:
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            ((string *)&local_a8,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,pDVar12);
  oneof_entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  oneof_entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  oneof_entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1 = (Descriptor *)(local_120 + 0x10);
  if (0 < *(int *)((long)&(((GeneratorOptions *)desc)->library).field_2 + 0xc)) {
    lVar15 = 0;
    do {
      pOVar18 = (OneofDescriptor *)
                (lVar15 * 0x30 +
                (((GeneratorOptions *)desc)->namespace_prefix).field_2._M_allocated_capacity);
      bVar6 = anon_unknown_0::IgnoreOneof(pOVar18);
      if (!bVar6) {
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < *(int *)(pOVar18 + 0x18)) {
          lVar17 = 0;
          do {
            bVar6 = anon_unknown_0::IgnoreField
                              (*(FieldDescriptor **)(*(long *)(pOVar18 + 0x20) + lVar17 * 8));
            if (!bVar6) {
              (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                        ((string *)local_120,
                         *(_anonymous_namespace_ **)(*(long *)(pOVar18 + 0x20) + lVar17 * 8),field);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &oneof_fields,(string *)local_120);
              if ((Descriptor *)local_120._0_8_ != pDVar1) {
                operator_delete((void *)local_120._0_8_);
              }
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(int *)(pOVar18 + 0x18));
        }
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_88,(protobuf *)&oneof_fields,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x3a7a50,(char *)pDVar12);
        puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x3edcd6)
        ;
        pFVar14 = (FieldDescriptor *)(puVar9 + 2);
        if ((FieldDescriptor *)*puVar9 == pFVar14) {
          local_e8._M_allocated_capacity = *(undefined8 *)pFVar14;
          local_e8._8_8_ = puVar9[3];
          local_f8._0_8_ = (FieldDescriptor *)(local_f8 + 0x10);
        }
        else {
          local_e8._M_allocated_capacity = *(undefined8 *)pFVar14;
          local_f8._0_8_ = (FieldDescriptor *)*puVar9;
        }
        local_f8._8_8_ = puVar9[1];
        *puVar9 = pFVar14;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_f8);
        pDVar12 = (Descriptor *)(puVar9 + 2);
        if ((Descriptor *)*puVar9 == pDVar12) {
          local_110._M_allocated_capacity = *(undefined8 *)pDVar12;
          local_110._8_8_ = puVar9[3];
          local_120._0_8_ = pDVar1;
        }
        else {
          local_110._M_allocated_capacity = *(undefined8 *)pDVar12;
          local_120._0_8_ = (Descriptor *)*puVar9;
        }
        local_120._8_8_ = puVar9[1];
        *puVar9 = pDVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &oneof_entries,(string *)local_120);
        if ((Descriptor *)local_120._0_8_ != pDVar1) {
          operator_delete((void *)local_120._0_8_);
        }
        if ((FieldDescriptor *)local_f8._0_8_ != (FieldDescriptor *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&oneof_fields);
        desc = (Descriptor *)local_100;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)((long)&(((GeneratorOptions *)desc)->library).field_2 + 0xc));
  }
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_f8,(protobuf *)&oneof_entries,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x3a7a50,(char *)pDVar12);
  puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x3edcd6);
  pDVar12 = (Descriptor *)(puVar9 + 2);
  if ((Descriptor *)*puVar9 == pDVar12) {
    local_110._M_allocated_capacity = *(undefined8 *)pDVar12;
    local_110._8_8_ = puVar9[3];
    local_120._0_8_ = pDVar1;
  }
  else {
    local_110._M_allocated_capacity = *(undefined8 *)pDVar12;
    local_120._0_8_ = (Descriptor *)*puVar9;
  }
  local_120._8_8_ = puVar9[1];
  *puVar9 = pDVar12;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_120);
  ppbVar2 = &numbers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar13 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar13) {
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
  }
  else {
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar7;
  }
  numbers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar7[1];
  *plVar7 = (long)pbVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((Descriptor *)local_120._0_8_ != pDVar1) {
    operator_delete((void *)local_120._0_8_);
  }
  pPVar4 = local_d0;
  pGVar10 = local_d8;
  if ((FieldDescriptor *)local_f8._0_8_ != (FieldDescriptor *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&oneof_entries);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[16],char_const*,char[12],std::__cxx11::string>
            (pPVar4,
             "/**\n * Oneof group definitions for this message. Each group defines the field\n * numbers belonging to that group. When of these fields\' value is set, all\n * other fields in the group are cleared. During deserialization, if multiple\n * fields are encountered for a group, only the last value seen will be kept.\n * @private {!Array<!Array<number>>}\n * @const\n */\n$classname$$oneofgrouparray$ = $oneofgroups$;\n\n"
             ,(char (*) [10])0x3aca6c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (char (*) [16])"oneofgrouparray",&(anonymous_namespace)::kOneofGroupArrayName,
             (char (*) [12])"oneofgroups",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numbers);
  if (numbers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
    operator_delete(numbers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  if (0 < *(int *)((long)&(((GeneratorOptions *)desc)->library).field_2 + 0xc)) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      pOVar18 = (OneofDescriptor *)
                ((((GeneratorOptions *)desc)->namespace_prefix).field_2._M_allocated_capacity +
                lVar15);
      bVar6 = anon_unknown_0::IgnoreOneof(pOVar18);
      if (!bVar6) {
        GenerateOneofCaseDefinition
                  ((Generator *)pOVar18,pGVar10,pPVar4,
                   (OneofDescriptor *)
                   ((((GeneratorOptions *)desc)->namespace_prefix).field_2._M_allocated_capacity +
                   lVar15));
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x30;
    } while (lVar17 < *(int *)((long)&(((GeneratorOptions *)desc)->library).field_2 + 0xc));
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldInfo(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc) const {
  if (HasRepeatedFields(options, desc)) {
    printer->Print(
        "/**\n"
        " * List of repeated fields within this message type.\n"
        " * @private {!Array<number>}\n"
        " * @const\n"
        " */\n"
        "$classname$$rptfieldarray$ = $rptfields$;\n"
        "\n",
        "classname", GetMessagePath(options, desc), "rptfieldarray",
        kRepeatedFieldArrayName, "rptfields",
        RepeatedFieldNumberList(options, desc));
  }

  if (HasOneofFields(desc)) {
    printer->Print(
        "/**\n"
        " * Oneof group definitions for this message. Each group defines the "
        "field\n"
        " * numbers belonging to that group. When of these fields' value is "
        "set, all\n"
        " * other fields in the group are cleared. During deserialization, if "
        "multiple\n"
        " * fields are encountered for a group, only the last value seen will "
        "be kept.\n"
        " * @private {!Array<!Array<number>>}\n"
        " * @const\n"
        " */\n"
        "$classname$$oneofgrouparray$ = $oneofgroups$;\n"
        "\n",
        "classname", GetMessagePath(options, desc), "oneofgrouparray",
        kOneofGroupArrayName, "oneofgroups", OneofGroupList(desc));

    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      GenerateOneofCaseDefinition(options, printer, desc->oneof_decl(i));
    }
  }
}